

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::find_and_replace
                   (string *__return_storage_ptr__,string *str,string *from,string *to)

{
  size_type sVar1;
  
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (str,from,sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (str,sVar1,from->_M_string_length,to);
    sVar1 = sVar1 + to->_M_string_length;
  }
  ::std::__cxx11::string::string(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string find_and_replace(std::string str, std::string from, std::string to) {

    std::size_t start_pos = 0;

    while((start_pos = str.find(from, start_pos)) != std::string::npos) {
        str.replace(start_pos, from.length(), to);
        start_pos += to.length();
    }

    return str;
}